

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expressionlistref.cpp
# Opt level: O1

string * __thiscall
duckdb::ExpressionListRef::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ExpressionListRef *this)

{
  string *psVar1;
  const_reference this_00;
  const_reference this_01;
  pointer pPVar2;
  size_type __n;
  size_type __n_00;
  string result;
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90 [16];
  string *local_80;
  vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
  *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  local_a0 = local_90;
  local_80 = __return_storage_ptr__;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"(VALUES ","");
  if ((this->values).
      super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
      .
      super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->values).
      super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
      .
      super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_78 = &this->values;
    __n = 0;
    do {
      if (__n != 0) {
        ::std::__cxx11::string::append((char *)&local_a0);
      }
      this_00 = vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_true>
                ::operator[](local_78,__n);
      ::std::__cxx11::string::append((char *)&local_a0);
      if ((this_00->
          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this_00->
          super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ).
          super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        __n_00 = 0;
        do {
          if (__n_00 != 0) {
            ::std::__cxx11::string::append((char *)&local_a0);
          }
          this_01 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                    ::operator[](this_00,__n_00);
          pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator->(this_01);
          (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[8])(local_70,pPVar2);
          ::std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_70[0]);
          if (local_70[0] != local_60) {
            operator_delete(local_70[0]);
          }
          __n_00 = __n_00 + 1;
        } while (__n_00 < (ulong)((long)(this_00->
                                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                        ).
                                        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this_00->
                                        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                        ).
                                        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      ::std::__cxx11::string::append((char *)&local_a0);
      __n = __n + 1;
    } while (__n < (ulong)(((long)(this->values).
                                  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
                                  .
                                  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->values).
                                  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
                                  .
                                  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          -0x5555555555555555));
  }
  ::std::__cxx11::string::append((char *)&local_a0);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_a0,local_a0 + local_98);
  psVar1 = local_80;
  TableRef::BaseToString(local_80,&this->super_TableRef,&local_50,&this->expected_names);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  return psVar1;
}

Assistant:

string ExpressionListRef::ToString() const {
	D_ASSERT(!values.empty());
	string result = "(VALUES ";
	for (idx_t row_idx = 0; row_idx < values.size(); row_idx++) {
		if (row_idx > 0) {
			result += ", ";
		}
		auto &row = values[row_idx];
		result += "(";
		for (idx_t col_idx = 0; col_idx < row.size(); col_idx++) {
			if (col_idx > 0) {
				result += ", ";
			}
			result += row[col_idx]->ToString();
		}
		result += ")";
	}
	result += ")";
	return BaseToString(result, expected_names);
}